

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

NodeIterator __thiscall
Indexing::RetrievalAlgorithms::
__selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::Literal*>>
          (RetrievalAlgorithms *this,IntermediateNode *n,RobSubstitution *subs,uint normInternalBank
          )

{
  int *piVar1;
  _func_int *p_Var2;
  IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
  *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 *puVar7;
  CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>_>_>
  *i;
  Top TVar8;
  VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
  local_88;
  IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
  *local_80;
  CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>_>_>
  local_78;
  VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
  local_58;
  CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>_>_>
  local_50;
  
  TVar8 = Kernel::RobSubstitution::getSpecialVarTop(subs,n->childVar,normInternalBank);
  if (((undefined1  [12])TVar8._inner._inner & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
    (*(n->super_Node)._vptr_Node[8])(this,n);
  }
  else {
    iVar6 = (*(n->super_Node)._vptr_Node[10])
                      (n,TVar8._inner._inner._0_8_,(ulong)TVar8._inner._inner._content[7],0);
    p_Var2 = (n->super_Node)._vptr_Node[9];
    if ((Node **)CONCAT44(extraout_var,iVar6) == (Node **)0x0) {
      (*p_Var2)(this,n);
    }
    else {
      (*p_Var2)(&local_80,n);
      pIVar3 = local_80;
      local_58._core = local_80;
      if (local_80 !=
          (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
           *)0x0) {
        local_80->_refCnt = local_80->_refCnt + 1;
      }
      ::Lib::
      concatIters<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal*>>::Node**>>
                ((Lib *)&local_88,&local_58);
      local_78._first = true;
      local_78._it1._0_8_ = local_78._it1._0_8_ & 0xffffffffffffff00;
      local_78._it2._iter._core =
           (VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
            )(VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
              )local_88._core;
      if (local_88._core !=
          (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
           *)0x0) {
        (local_88._core)->_refCnt = (local_88._core)->_refCnt + 1;
      }
      local_78._it1._el = (Node **)CONCAT44(extraout_var,iVar6);
      ::Lib::
      iterTraits<Lib::CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal*>>::Node**>,Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal*>>::Node**>>>>
                ((IterTraits<Lib::CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>_>_>_>
                  *)&local_50,(Lib *)&local_78,i);
      if (local_78._it2._iter._core !=
          (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
           *)0x0) {
        piVar1 = (int *)((long)local_78._it2._iter._core + 8);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(*(_func_int ***)local_78._it2._iter._core)[1])();
        }
      }
      if (local_88._core !=
          (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
           *)0x0) {
        piVar1 = &(local_88._core)->_refCnt;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_88._core)->_vptr_IteratorCore[1])();
        }
      }
      if (pIVar3 != (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
                     *)0x0) {
        piVar1 = &pIVar3->_refCnt;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*pIVar3->_vptr_IteratorCore[1])(pIVar3);
        }
      }
      puVar7 = (undefined8 *)
               ::Lib::FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60))
      ;
      local_78._it1._el = local_50._it1._el;
      local_78._first = local_50._first;
      local_78._1_7_ = local_50._1_7_;
      uVar4 = local_78._0_8_;
      local_78._it1._finished = local_50._it1._finished;
      local_78._it1._1_7_ = local_50._it1._1_7_;
      uVar5 = local_78._it1._0_8_;
      if (local_50._it2._iter._core !=
          (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
           *)0x0) {
        *(int *)((long)local_50._it2._iter._core + 8U) =
             *(int *)((long)local_50._it2._iter._core + 8U) + 1;
      }
      *(undefined4 *)(puVar7 + 1) = 0;
      *puVar7 = &PTR__ProxyIterator_00b60000;
      local_78._0_4_ = local_50._0_4_;
      local_78._4_4_ = local_50._4_4_;
      local_78._it1._0_4_ = local_50._it1._0_4_;
      local_78._it1._4_4_ = local_50._it1._4_4_;
      *(undefined4 *)(puVar7 + 2) = local_78._0_4_;
      *(undefined4 *)((long)puVar7 + 0x14) = local_78._4_4_;
      *(undefined4 *)(puVar7 + 3) = local_78._it1._0_4_;
      *(undefined4 *)((long)puVar7 + 0x1c) = local_78._it1._4_4_;
      puVar7[4] = local_50._it1._el;
      ((VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
        *)(puVar7 + 5))->_core =
           (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
            *)local_50._it2._iter._core;
      local_78._0_8_ = uVar4;
      local_78._it1._0_8_ = uVar5;
      if (local_50._it2._iter._core ==
          (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
           *)0x0) {
        *(undefined8 **)this = puVar7;
        *(undefined4 *)(puVar7 + 1) = 1;
      }
      else {
        *(int *)((long)local_50._it2._iter._core + 8U) =
             *(int *)((long)local_50._it2._iter._core + 8U) + 1;
        *(undefined8 **)this = puVar7;
        *(int *)(puVar7 + 1) = *(int *)(puVar7 + 1) + 1;
        piVar1 = (int *)((long)local_50._it2._iter._core + 8);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (**(code **)(*(long *)local_50._it2._iter._core + 8))();
        }
      }
      if (local_50._it2._iter._core !=
          (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
           *)0x0) {
        piVar1 = (int *)((long)local_50._it2._iter._core + 8);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(*(_func_int ***)local_50._it2._iter._core)[1])();
        }
      }
      if (local_80 !=
          (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
           *)0x0) {
        piVar1 = &local_80->_refCnt;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*local_80->_vptr_IteratorCore[1])();
        }
      }
    }
  }
  return (NodeIterator)
         (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>
          *)this;
}

Assistant:

static typename SubstitutionTree<LD>::NodeIterator __selectPotentiallyUnifiableChildren(typename SubstitutionTree<LD>::IntermediateNode* n, RobSubstitution& subs, unsigned normInternalBank)
      {
        unsigned specVar=n->childVar;
        auto top = subs.getSpecialVarTop(specVar, normInternalBank);
        if(top.var()) {
          return n->allChildren();
        } else {
          auto** match = n->childByTop(top, /* canCreate */ false);
          if(match) {
            return pvi(concatIters(
                         getSingletonIterator(match),
                         n->variableChildren()));
          } else {
            return n->variableChildren();
          }
        }
      }